

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::arraySizeCheck
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *expr,TArraySize *sizePair)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar3;
  
  sizePair->size = 1;
  sizePair->node = (TIntermTyped *)0x0;
  iVar1 = (*(expr->super_TIntermNode)._vptr_TIntermNode[5])(expr);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    iVar1 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x21])(expr);
    if ((*(byte *)(CONCAT44(extraout_var_00,iVar1) + 0xc) & 1) != 0) {
      sizePair->node = expr;
      iVar1 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0xc])(expr);
      if (((CONCAT44(extraout_var_01,iVar1) != 0) &&
          (lVar2 = *(long *)(CONCAT44(extraout_var_01,iVar1) + 0x128), lVar2 != 0)) &&
         (0 < (int)((ulong)(*(long *)(lVar2 + 0x10) - *(long *)(lVar2 + 8)) >> 4)))
      goto LAB_00393d9b;
      goto LAB_00393da4;
    }
  }
  else {
    lVar2 = *(long *)(CONCAT44(extraout_var,iVar1) + 0xc0);
LAB_00393d9b:
    sizePair->size = **(uint **)(lVar2 + 8);
LAB_00393da4:
    iVar1 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(expr);
    if ((iVar1 == 8) ||
       (iVar1 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(expr), iVar1 == 9)) {
      if (sizePair->size != 0) {
        return;
      }
      pcVar3 = "array size must be a positive integer";
      goto LAB_00393dfd;
    }
  }
  pcVar3 = "array size must be a constant integer expression";
LAB_00393dfd:
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar3,"","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::arraySizeCheck(const TSourceLoc& loc, TIntermTyped* expr, TArraySize& sizePair)
{
    bool isConst = false;
    sizePair.size = 1;
    sizePair.node = nullptr;

    TIntermConstantUnion* constant = expr->getAsConstantUnion();
    if (constant) {
        // handle true (non-specialization) constant
        sizePair.size = constant->getConstArray()[0].getIConst();
        isConst = true;
    } else {
        // see if it's a specialization constant instead
        if (expr->getQualifier().isSpecConstant()) {
            isConst = true;
            sizePair.node = expr;
            TIntermSymbol* symbol = expr->getAsSymbolNode();
            if (symbol && symbol->getConstArray().size() > 0)
                sizePair.size = symbol->getConstArray()[0].getIConst();
        }
    }

    if (! isConst || (expr->getBasicType() != EbtInt && expr->getBasicType() != EbtUint)) {
        error(loc, "array size must be a constant integer expression", "", "");
        return;
    }

    if (sizePair.size <= 0) {
        error(loc, "array size must be a positive integer", "", "");
        return;
    }
}